

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformGradient.cpp
# Opt level: O1

void __thiscall OpenMD::UniformGradient::UniformGradient(UniformGradient *this,SimInfo *info)

{
  (this->super_ForceModifier).info_ = info;
  (this->super_ForceModifier)._vptr_ForceModifier = (_func_int **)&PTR__UniformGradient_002ac750;
  this->initialized = false;
  this->doUniformGradient = false;
  this->doParticlePot = false;
  memset(&this->Grad_,0,0x88);
  this->simParams = info->simParams_;
  return;
}

Assistant:

UniformGradient::UniformGradient(SimInfo* info) :
      ForceModifier {info}, initialized {false}, doUniformGradient {false},
      doParticlePot {false} {
    simParams = info_->getSimParams();
  }